

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_exhaustive_tri_around_node
          (REF_INTERP ref_interp,REF_INT node,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined8 uVar4;
  REF_INT cell_00;
  REF_STATUS ref_private_macro_code_rxs;
  undefined4 in_register_00000034;
  REF_CELL ref_cell;
  REF_DBL *in_R9;
  char *pcVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  REF_DBL current_bary [4];
  REF_INT nodes [27];
  int local_f0;
  uint local_ec;
  double local_e8;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = (REF_CELL)CONCAT44(in_register_00000034,node);
  if ((((int)xyz < 0) || (pRVar1 = ref_cell->ref_adj, pRVar1->nnode <= (int)xyz)) ||
     (lVar8 = (long)pRVar1->first[(ulong)xyz & 0xffffffff], lVar8 == -1)) {
LAB_0015693a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x69,
           "ref_interp_exhaustive_tri_around_node","failed to find cell");
    RVar6 = 1;
  }
  else {
    cell_00 = pRVar1->item[lVar8].ref;
    uVar3 = ref_cell_nodes(ref_cell,cell_00,local_a8);
    if (uVar3 == 0) {
      local_f0 = -1;
      local_e8 = -999.0;
      do {
        uVar3 = ref_node_bary3((REF_NODE)ref_interp,local_a8,(REF_DBL *)cell,&local_c8);
        local_b0 = 0;
        if ((uVar3 & 0xfffffffb) != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x5f,"ref_interp_exhaustive_tri_around_node",(ulong)uVar3,"bary");
          local_ec = uVar3;
        }
        if (uVar3 != 4) {
          if (uVar3 != 0) {
            return local_ec;
          }
          dVar9 = local_c8;
          if (local_c0 <= local_c8) {
            dVar9 = local_c0;
          }
          if (local_b8 <= dVar9) {
            dVar9 = local_b8;
          }
          if ((local_f0 == -1) || (local_e8 < dVar9)) {
            local_f0 = cell_00;
            local_e8 = dVar9;
          }
        }
        pRVar2 = ref_cell->ref_adj->item;
        lVar8 = (long)pRVar2[(int)lVar8].next;
        if (lVar8 == -1) {
          if (local_f0 == -1) goto LAB_0015693a;
          *(int *)bary = local_f0;
          uVar3 = ref_cell_nodes(ref_cell,local_f0,local_a8);
          if (uVar3 == 0) {
            uVar3 = ref_node_bary3((REF_NODE)ref_interp,local_a8,(REF_DBL *)cell,in_R9);
            if (uVar3 == 0) {
              in_R9[3] = 0.0;
              return 0;
            }
            uVar7 = (ulong)uVar3;
            pcVar5 = "bary";
            uVar4 = 0x6d;
          }
          else {
            uVar7 = (ulong)uVar3;
            pcVar5 = "cell";
            uVar4 = 0x6c;
          }
          goto LAB_001567e8;
        }
        cell_00 = pRVar2[lVar8].ref;
        uVar3 = ref_cell_nodes(ref_cell,cell_00,local_a8);
      } while (uVar3 == 0);
    }
    uVar7 = (ulong)uVar3;
    pcVar5 = "cell";
    uVar4 = 0x5c;
LAB_001567e8:
    RVar6 = (REF_STATUS)uVar7;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar4,
           "ref_interp_exhaustive_tri_around_node",uVar7,pcVar5);
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_exhaustive_tri_around_node(
    REF_INTERP ref_interp, REF_INT node, REF_DBL *xyz, REF_INT *cell,
    REF_DBL *bary) {
  REF_CELL ref_cell = ref_interp_from_tri(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, candidate, best_candidate;
  REF_DBL current_bary[4];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_cell_having_node(ref_cell, node, item, candidate) {
    RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
    status = ref_node_bary3(ref_node, nodes, xyz, current_bary);
    current_bary[3] = 0.0;
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */
      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find cell");

  *cell = best_candidate;
  RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
  RSS(ref_node_bary3(ref_node, nodes, xyz, bary), "bary");
  bary[3] = 0.0;

  return REF_SUCCESS;
}